

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionResultData::~AssertionResultData(AssertionResultData *this)

{
  AssertionResultData *this_local;
  
  std::__cxx11::string::~string((string *)&this->message);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

AssertionResultData() : resultType( ResultWas::Unknown ) {}